

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

string * __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::extend_string
          (string *__return_storage_ptr__,TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,
          string *base_string,string *sub_string,size_t number_of_elements)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (base_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + base_string->_M_string_length);
  if (number_of_elements != 0) {
    do {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(sub_string->_M_dataplus)._M_p);
      number_of_elements = number_of_elements - 1;
    } while (number_of_elements != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase<API>::extend_string(std::string base_string, std::string sub_string, size_t number_of_elements)
{
	std::string temp_string = base_string;

	for (size_t sub_script_index = 0; sub_script_index < number_of_elements; sub_script_index++)
	{
		temp_string += sub_string;
	}

	return temp_string;
}